

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase *
EvaluateGenericFunctionPrototype
          (ExpressionEvalContext *ctx,ExprGenericFunctionPrototype *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  ExprVariableDefinition *expression_00;
  bool bVar4;
  int iVar5;
  StackFrame **ppSVar6;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  IntrusiveList<ExprVariableDefinition> *pIVar9;
  ExprBase *pEVar7;
  
  if (((ctx->stackFrames).count == 0) ||
     (ppSVar6 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar6)->targetYield == 0)) {
    bVar4 = AddInstruction(ctx);
    if (bVar4) {
      pIVar9 = &expression->contextVariables;
      pEVar7 = (ExprBase *)0x0;
      do {
        expression_00 = pIVar9->head;
        if (expression_00 == (ExprVariableDefinition *)0x0) goto LAB_0022d5bc;
        pEVar8 = Evaluate(ctx,&expression_00->super_ExprBase);
        pIVar9 = (IntrusiveList<ExprVariableDefinition> *)&(expression_00->super_ExprBase).next;
      } while (pEVar8 != (ExprBase *)0x0);
    }
    else {
      pEVar7 = (ExprBase *)0x0;
    }
  }
  else {
LAB_0022d5bc:
    pAVar1 = ctx->ctx->allocator;
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar2;
    pEVar7->type = pTVar3;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
  }
  return pEVar7;
}

Assistant:

ExprBase* EvaluateGenericFunctionPrototype(ExpressionEvalContext &ctx, ExprGenericFunctionPrototype *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	for(ExprBase *expr = expression->contextVariables.head; expr; expr = expr->next)
	{
		if(!Evaluate(ctx, expr))
			return NULL;
	}

	return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);
}